

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_misc.h
# Opt level: O0

mbedtls_x509_crt * mbedtls_ssl_own_cert(mbedtls_ssl_context *ssl)

{
  mbedtls_x509_crt *local_20;
  mbedtls_ssl_key_cert *local_18;
  mbedtls_ssl_key_cert *key_cert;
  mbedtls_ssl_context *ssl_local;
  
  if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
     (ssl->handshake->key_cert == (mbedtls_ssl_key_cert *)0x0)) {
    local_18 = ssl->conf->key_cert;
  }
  else {
    local_18 = ssl->handshake->key_cert;
  }
  if (local_18 == (mbedtls_ssl_key_cert *)0x0) {
    local_20 = (mbedtls_x509_crt *)0x0;
  }
  else {
    local_20 = local_18->cert;
  }
  return local_20;
}

Assistant:

static inline mbedtls_x509_crt *mbedtls_ssl_own_cert(mbedtls_ssl_context *ssl)
{
    mbedtls_ssl_key_cert *key_cert;

    if (ssl->handshake != NULL && ssl->handshake->key_cert != NULL) {
        key_cert = ssl->handshake->key_cert;
    } else {
        key_cert = ssl->conf->key_cert;
    }

    return key_cert == NULL ? NULL : key_cert->cert;
}